

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

void __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::joinArray
          (Interpreter *this,bool *first,
          vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
          *running,Value *sep,uint idx,Value *elt)

{
  pointer pFVar1;
  ostream *poVar2;
  RuntimeError *__return_storage_ptr__;
  Type t;
  stringstream ss;
  string local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  if (elt->t == NULL_TYPE) {
    return;
  }
  if (elt->t == ARRAY) {
    if (*first == false) {
      std::
      vector<jsonnet::internal::(anonymous_namespace)::HeapThunk*,std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk*>>
      ::
      insert<__gnu_cxx::__normal_iterator<jsonnet::internal::(anonymous_namespace)::HeapThunk**,std::vector<jsonnet::internal::(anonymous_namespace)::HeapThunk*,std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk*>>>,void>
                ((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk*,std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk*>>
                  *)running,
                 (const_iterator)
                 (running->
                 super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish,
                 (__normal_iterator<jsonnet::internal::(anonymous_namespace)::HeapThunk_**,_std::vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                  )*(HeapThunk ***)(sep + 1),
                 (__normal_iterator<jsonnet::internal::(anonymous_namespace)::HeapThunk_**,_std::vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                  )sep[1].v);
    }
    *first = false;
    std::
    vector<jsonnet::internal::(anonymous_namespace)::HeapThunk*,std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk*>>
    ::
    insert<__gnu_cxx::__normal_iterator<jsonnet::internal::(anonymous_namespace)::HeapThunk**,std::vector<jsonnet::internal::(anonymous_namespace)::HeapThunk*,std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk*>>>,void>
              ((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk*,std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk*>>
                *)running,
               (const_iterator)
               (running->
               super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
               )._M_impl.super__Vector_impl_data._M_finish,
               (__normal_iterator<jsonnet::internal::(anonymous_namespace)::HeapThunk_**,_std::vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                )(elt->v).h[1]._vptr_HeapEntity,
               (__normal_iterator<jsonnet::internal::(anonymous_namespace)::HeapThunk_**,_std::vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                )*(HeapThunk ***)&(elt->v).h[1].mark);
    return;
  }
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"expected array but arr[",0x17);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"] was ",6);
  (anonymous_namespace)::type_str_abi_cxx11_(&local_1d0,(_anonymous_namespace_ *)(ulong)elt->t,t);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  __return_storage_ptr__ = (RuntimeError *)__cxa_allocate_exception(0x38);
  pFVar1 = (this->stack).stack.
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::stringbuf::str();
  Stack::makeError(__return_storage_ptr__,&this->stack,&pFVar1[-1].location,&local_1d0);
  __cxa_throw(__return_storage_ptr__,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
}

Assistant:

void joinArray(bool &first, std::vector<HeapThunk*> &running, const Value &sep, unsigned idx,
                   const Value &elt)
    {
        if (elt.t == Value::NULL_TYPE) {
            return;
        }
        if (elt.t != Value::ARRAY) {
            std::stringstream ss;
            ss << "expected array but arr[" << idx << "] was " << type_str(elt);
            throw makeError(stack.top().location, ss.str());
        }
        if (!first) {
            auto& elts = static_cast<HeapArray *>(sep.v.h)->elements;
            running.insert(running.end(), elts.begin(), elts.end());
        }
        first = false;
        auto& elts = static_cast<HeapArray *>(elt.v.h)->elements;
        running.insert(running.end(), elts.begin(), elts.end());
    }